

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cc
# Opt level: O1

bool __thiscall tchecker::zg::zone_t::is_am_le(zone_t *this,zone_t *zone,map_t *m)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = tchecker::dbm::is_empty_0((db_t *)(this + 1),this->_dim);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = tchecker::dbm::is_empty_0((db_t *)(zone + 1),zone->_dim);
    if (!bVar1) {
      bVar1 = tchecker::dbm::is_am_le
                        ((db_t *)(this + 1),(db_t *)(zone + 1),this->_dim,(integer_t *)&m->_fam);
      return bVar1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool zone_t::is_am_le(tchecker::zg::zone_t const & zone, tchecker::clockbounds::map_t const & m) const
{
  if (this->is_empty())
    return true;
  if (zone.is_empty())
    return false;
  return tchecker::dbm::is_am_le(dbm_ptr(), zone.dbm_ptr(), _dim, m.ptr());
}